

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O3

Matrix44<float> * __thiscall
Imath_2_5::Matrix44<float>::gjInverse
          (Matrix44<float> *__return_storage_ptr__,Matrix44<float> *this,bool singExc)

{
  ulong uVar1;
  float *pfVar2;
  float *pfVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  float fVar8;
  ulong uVar9;
  float *pfVar10;
  undefined1 (*pauVar11) [16];
  SingMatrixExc *this_00;
  undefined8 *puVar12;
  float *pfVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  undefined8 *puVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  Matrix44<float> s;
  float local_b8 [16];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [12];
  float fStack_3c;
  
  pfVar10 = local_b8;
  local_b8[6] = 0.0;
  local_b8[7] = 0.0;
  local_b8[8] = 0.0;
  local_b8[9] = 0.0;
  local_b8[0xb] = 0.0;
  local_b8[0xc] = 0.0;
  local_b8[1] = 0.0;
  local_b8[2] = 0.0;
  local_b8[3] = 0.0;
  local_b8[4] = 0.0;
  local_b8[0xd] = 0.0;
  local_b8[0xe] = 0.0;
  local_b8[0] = 1.0;
  local_b8[5] = 1.0;
  local_b8[10] = 1.0;
  local_b8[0xf] = 1.0;
  puVar12 = &local_68;
  local_78 = *(undefined8 *)this->x[0];
  uStack_70 = *(undefined8 *)(this->x[0] + 2);
  local_68 = *(undefined8 *)this->x[1];
  uStack_60 = *(undefined8 *)(this->x[1] + 2);
  local_58 = *(undefined8 *)this->x[2];
  uStack_50 = *(undefined8 *)(this->x[2] + 2);
  local_48._0_8_ = *(undefined8 *)this->x[3];
  stack0xffffffffffffffc0 = *(undefined8 *)(this->x[3] + 2);
  uVar16 = 1;
  lVar17 = 0x30;
  puVar18 = &local_78;
  uVar19 = 0;
  do {
    pfVar13 = (float *)(&local_78 + uVar19 * 2);
    uVar1 = uVar19 + 1;
    fVar26 = pfVar13[uVar19];
    fVar23 = -fVar26;
    if (-fVar26 <= fVar26) {
      fVar23 = fVar26;
    }
    lVar21 = 0;
    iVar15 = (int)uVar16;
    uVar14 = uVar19 & 0xffffffff;
    do {
      fVar26 = *(float *)((long)puVar12 + lVar21);
      fVar24 = -fVar26;
      if (-fVar26 <= fVar26) {
        fVar24 = fVar26;
      }
      uVar9 = uVar16;
      if (fVar24 <= fVar23) {
        fVar24 = fVar23;
        uVar9 = uVar14;
      }
      uVar14 = uVar9;
      uVar16 = (ulong)((int)uVar16 + 1);
      lVar21 = lVar21 + 0x10;
      fVar23 = fVar24;
    } while (lVar17 != lVar21);
    if ((fVar24 == 0.0) && (!NAN(fVar24))) goto LAB_001d7a59;
    if (uVar19 != uVar14) {
      lVar21 = (long)(int)uVar14;
      lVar20 = 0;
      do {
        uVar4 = *(undefined4 *)((long)puVar18 + lVar20 * 4);
        *(undefined4 *)((long)puVar18 + lVar20 * 4) =
             *(undefined4 *)((long)&local_78 + lVar20 * 4 + lVar21 * 0x10);
        *(undefined4 *)((long)&local_78 + lVar20 * 4 + lVar21 * 0x10) = uVar4;
        fVar26 = *(float *)((long)pfVar10 + lVar20 * 4);
        *(float *)((long)pfVar10 + lVar20 * 4) = local_b8[lVar21 * 4 + lVar20];
        local_b8[lVar21 * 4 + lVar20] = fVar26;
        lVar20 = lVar20 + 1;
      } while (lVar20 != 4);
    }
    lVar21 = 0x10;
    uVar16 = uVar19;
    do {
      fVar25 = -*(float *)((long)puVar12 + lVar21 + -0x10) / pfVar13[uVar19];
      fVar26 = *(float *)((long)&local_78 + uVar19 * 0x10 + 4);
      fVar23 = *(float *)(&uStack_70 + uVar19 * 2);
      fVar24 = *(float *)((long)&uStack_70 + uVar19 * 0x10 + 4);
      pfVar2 = (float *)((long)puVar18 + lVar21);
      fVar6 = pfVar2[1];
      fVar7 = pfVar2[2];
      fVar8 = pfVar2[3];
      pfVar3 = (float *)((long)puVar18 + lVar21);
      *pfVar3 = *pfVar13 * fVar25 + *pfVar2;
      pfVar3[1] = fVar26 * fVar25 + fVar6;
      pfVar3[2] = fVar23 * fVar25 + fVar7;
      pfVar3[3] = fVar24 * fVar25 + fVar8;
      fVar26 = local_b8[uVar19 * 4 + 1];
      fVar23 = local_b8[uVar19 * 4 + 2];
      fVar24 = local_b8[uVar19 * 4 + 3];
      pfVar2 = (float *)((long)pfVar10 + lVar21);
      fVar6 = pfVar2[1];
      fVar7 = pfVar2[2];
      fVar8 = pfVar2[3];
      pfVar3 = (float *)((long)pfVar10 + lVar21);
      *pfVar3 = fVar25 * local_b8[uVar19 * 4] + *pfVar2;
      pfVar3[1] = fVar25 * fVar26 + fVar6;
      pfVar3[2] = fVar25 * fVar23 + fVar7;
      pfVar3[3] = fVar25 * fVar24 + fVar8;
      uVar16 = uVar16 + 1;
      lVar21 = lVar21 + 0x10;
    } while (uVar16 < 3);
    uVar16 = (ulong)(iVar15 + 1);
    puVar12 = (undefined8 *)((long)puVar12 + 0x14);
    lVar17 = lVar17 + -0x10;
    pfVar10 = (float *)((long)pfVar10 + 0x10);
    puVar18 = puVar18 + 2;
    uVar19 = uVar1;
  } while (uVar1 != 3);
  if ((fStack_3c != 0.0) || (NAN(fStack_3c))) {
    pauVar11 = (undefined1 (*) [16])local_48;
    pfVar10 = local_b8 + 0xc;
    lVar17 = 3;
    fVar26 = fStack_3c;
    do {
      auVar27._4_4_ = fVar26;
      auVar27._0_4_ = fVar26;
      auVar27._8_4_ = fVar26;
      auVar27._12_4_ = fVar26;
      auVar27 = divps(*pauVar11,auVar27);
      *pauVar11 = auVar27;
      auVar5._4_4_ = fVar26;
      auVar5._0_4_ = fVar26;
      auVar5._8_4_ = fVar26;
      auVar5._12_4_ = fVar26;
      auVar27 = divps(*(undefined1 (*) [16])(local_b8 + lVar17 * 4),auVar5);
      *(undefined1 (*) [16])(local_b8 + lVar17 * 4) = auVar27;
      lVar21 = lVar17 + -1;
      if (lVar17 == 0) {
        *(ulong *)__return_storage_ptr__->x[0] = CONCAT44(local_b8[1],local_b8[0]);
        *(ulong *)(__return_storage_ptr__->x[0] + 2) = CONCAT44(local_b8[3],local_b8[2]);
        *(ulong *)__return_storage_ptr__->x[1] = CONCAT44(local_b8[5],local_b8[4]);
        *(ulong *)(__return_storage_ptr__->x[1] + 2) = CONCAT44(local_b8[7],local_b8[6]);
        *(ulong *)__return_storage_ptr__->x[2] = CONCAT44(local_b8[9],local_b8[8]);
        *(ulong *)(__return_storage_ptr__->x[2] + 2) = CONCAT44(local_b8[0xb],local_b8[10]);
        *(ulong *)__return_storage_ptr__->x[3] = CONCAT44(local_b8[0xd],local_b8[0xc]);
        __return_storage_ptr__->x[3][2] = local_b8[0xe];
        goto LAB_001d7a89;
      }
      lVar20 = 0;
      pfVar13 = local_b8;
      puVar12 = &local_78;
      do {
        fVar26 = -*(float *)((long)&local_78 + lVar17 * 4 + lVar20 * 0x10);
        lVar22 = 0;
        do {
          fVar23 = *(float *)((long)pfVar10 + lVar22);
          fVar24 = *(float *)((long)pfVar13 + lVar22);
          *(float *)((long)puVar12 + lVar22) =
               *(float *)(*pauVar11 + lVar22) * fVar26 + *(float *)((long)puVar12 + lVar22);
          *(float *)((long)pfVar13 + lVar22) = fVar23 * fVar26 + fVar24;
          lVar22 = lVar22 + 4;
        } while (lVar22 != 0x10);
        lVar20 = lVar20 + 1;
        pfVar13 = (float *)((long)pfVar13 + 0x10);
        puVar12 = puVar12 + 2;
      } while (lVar20 != lVar17);
      fVar26 = *(float *)(pauVar11[-2] + lVar17 * 4 + 0xc);
      pauVar11 = pauVar11 + -1;
      pfVar10 = pfVar10 + -4;
      lVar17 = lVar21;
    } while ((fVar26 != 0.0) || (NAN(fVar26)));
  }
LAB_001d7a59:
  if (singExc) {
    this_00 = (SingMatrixExc *)__cxa_allocate_exception(0x48);
    SingMatrixExc::SingMatrixExc(this_00,"Cannot invert singular matrix.");
    __cxa_throw(this_00,&SingMatrixExc::typeinfo,SingMatrixExc::~SingMatrixExc);
  }
  *(float *)((long)(__return_storage_ptr__->x + 1) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 1) + 8) = 0.0;
  *(undefined8 *)(__return_storage_ptr__->x[1] + 3) = 0;
  *(float *)((long)(__return_storage_ptr__->x + 2) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 2) + 8) = 0.0;
  *(undefined8 *)(__return_storage_ptr__->x[2] + 3) = 0;
  *(float *)((long)(__return_storage_ptr__->x + 0) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 0) + 8) = 0.0;
  *(undefined8 *)(__return_storage_ptr__->x[0] + 3) = 0;
  *(float *)((long)(__return_storage_ptr__->x + 3) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 3) + 8) = 0.0;
  __return_storage_ptr__->x[0][0] = 1.0;
  __return_storage_ptr__->x[1][1] = 1.0;
  __return_storage_ptr__->x[2][2] = 1.0;
  local_b8[0xf] = 1.0;
LAB_001d7a89:
  __return_storage_ptr__->x[3][3] = local_b8[0xf];
  return __return_storage_ptr__;
}

Assistant:

inline
Matrix44<T>::Matrix44 ()
{
    memset (x, 0, sizeof (x));
    x[0][0] = 1;
    x[1][1] = 1;
    x[2][2] = 1;
    x[3][3] = 1;
}